

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
read_file<char>(basic_istream<char,_std::char_traits<char>_> *in)

{
  bool bVar1;
  long *plVar2;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res;
  undefined1 local_12;
  
  std::__cxx11::string::string((string *)in_RDI);
  while( true ) {
    plVar2 = (long *)std::istream::get(in_RSI);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)in_RDI,local_12);
  }
  return in_RDI;
}

Assistant:

std::basic_string<Char> read_file(std::basic_istream<Char> &in)
{
    std::basic_string<Char> res;
    Char c;
    while(in.get(c))
        res+=c;
    return res;
}